

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O0

void shared_strings_callback_skip_tag_end(void *callbackdata,XML_Char *name)

{
  int iVar1;
  long lVar2;
  shared_strings_callback_data *data;
  XML_Char *name_local;
  void *callbackdata_local;
  
  if (((name == (XML_Char *)0x0) ||
      (iVar1 = strcasecmp(name,*(char **)((long)callbackdata + 0x30)), iVar1 == 0)) &&
     (lVar2 = *(long *)((long)callbackdata + 0x38) + -1,
     *(long *)((long)callbackdata + 0x38) = lVar2, lVar2 == 0)) {
    XML_SetElementHandler
              (*callbackdata,*(undefined8 *)((long)callbackdata + 0x40),
               *(undefined8 *)((long)callbackdata + 0x48));
    XML_SetCharacterDataHandler(*callbackdata,*(undefined8 *)((long)callbackdata + 0x50));
    free(*(void **)((long)callbackdata + 0x30));
    *(undefined8 *)((long)callbackdata + 0x30) = 0;
  }
  return;
}

Assistant:

void shared_strings_callback_skip_tag_end (void* callbackdata, const XML_Char* name)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (!name || XML_Char_icmp(name, data->skiptag) == 0) {
    if (--data->skiptagcount == 0) {
      //restore handlers when done skipping
      XML_SetElementHandler(data->xmlparser, data->skip_start, data->skip_end);
      XML_SetCharacterDataHandler(data->xmlparser, data->skip_data);
      free(data->skiptag);
      data->skiptag = NULL;
    }
  }
}